

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_add_lines(SAM_hdr *sh,char *lines,int len)

{
  char cVar1;
  size_t sVar2;
  SAM_hdr_type **ppSVar3;
  SAM_hdr_item_s *pSVar4;
  char cVar5;
  int iVar6;
  khint_t kVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  SAM_hdr_type *h_type;
  SAM_hdr_type *pSVar11;
  ulong uVar12;
  char *pcVar13;
  SAM_hdr_tag *pSVar14;
  SAM_hdr_tag *pSVar15;
  char *pcVar16;
  SAM_hdr *pSVar17;
  ulong uVar18;
  int iVar19;
  uint uVar21;
  uint key;
  char *pcVar22;
  int l;
  int iVar23;
  ulong uVar24;
  int new;
  SAM_hdr_tag *local_40;
  SAM_hdr_tag *local_38;
  int iVar20;
  
  sVar9 = (size_t)(uint)len;
  if (len == 0) {
    sVar9 = strlen(lines);
  }
  sVar2 = (sh->text).l;
  l = (int)sVar9;
  iVar6 = kputsn(lines,l,&sh->text);
  iVar8 = -1;
  if (iVar6 != -1) {
    iVar23 = (int)sVar2;
    pcVar22 = (sh->text).s;
    iVar6 = 0;
    iVar8 = -1;
    while (l - iVar6 != 0 && iVar6 <= l) {
      lVar10 = (long)iVar6;
      pcVar16 = pcVar22 + lVar10 + iVar23;
      if (pcVar22[lVar10 + iVar23] != '@') {
        pcVar22 = "Header line does not start with \'@\'";
        goto LAB_0012f196;
      }
      cVar5 = pcVar16[1];
      iVar8 = cVar5 + -0x7b;
      if ((byte)iVar8 < 0xc6) {
LAB_0012f18a:
        pcVar22 = "Header line does not have a two character key";
LAB_0012f196:
        sam_hdr_error(pcVar22,pcVar16,l - iVar6,iVar8);
        return -1;
      }
      cVar1 = pcVar16[2];
      iVar8 = (int)cVar1 - 0x7b;
      if ((byte)iVar8 < 0xc6) goto LAB_0012f18a;
      uVar18 = lVar10 + 3;
      if (pcVar22[lVar10 + (long)iVar23 + 3] != '\n') {
        h_type = (SAM_hdr_type *)pool_alloc(sh->type_pool);
        if (h_type == (SAM_hdr_type *)0x0) {
          return -1;
        }
        key = (int)cVar5 << 8 | (int)cVar1;
        kVar7 = kh_put_sam_hdr(sh->h,key,&new);
        if (kVar7 == 0xffffffff) {
          return -1;
        }
        ppSVar3 = sh->h->vals;
        if (new == 0) {
          pSVar11 = ppSVar3[kVar7];
          pSVar4 = pSVar11->prev;
          pSVar4->next = h_type;
          h_type->prev = pSVar4;
          pSVar11->prev = h_type;
          pSVar17 = (SAM_hdr *)(ulong)(pSVar4->order + 1);
        }
        else {
          ppSVar3[kVar7] = h_type;
          h_type->prev = h_type;
          pSVar17 = (SAM_hdr *)0x0;
          pSVar11 = h_type;
        }
        h_type->next = pSVar11;
        iVar8 = (int)pSVar17;
        h_type->order = iVar8;
        if (cVar1 == 'O' && cVar5 == 'C') {
          if (pcVar22[uVar18 + (long)iVar23] != '\t') {
LAB_0012f16b:
            pcVar22 = "Missing tab";
            goto LAB_0012f196;
          }
          uVar21 = iVar6 + 4;
          uVar24 = (ulong)(int)uVar21;
          uVar18 = (ulong)uVar21;
          uVar12 = uVar24;
          if ((int)uVar21 < l) {
            uVar18 = sVar9 & 0xffffffff;
          }
          for (; (long)uVar12 < (long)l; uVar12 = uVar12 + 1) {
            if (pcVar22[uVar12 + (long)iVar23] == '\n') {
              uVar18 = uVar12 & 0xffffffff;
              break;
            }
          }
          pSVar15 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
          h_type->tag = pSVar15;
          if (pSVar15 == (SAM_hdr_tag *)0x0) {
            return -1;
          }
          iVar8 = (int)uVar18 - uVar21;
          pcVar16 = string_ndup(sh->str_pool,pcVar22 + uVar24 + (long)iVar23,(long)iVar8);
          pSVar15->str = pcVar16;
          pSVar15->len = iVar8;
          pSVar15->next = (SAM_hdr_tag_s *)0x0;
          if (pcVar16 == (char *)0x0) {
            return -1;
          }
        }
        else {
          local_38 = (SAM_hdr_tag *)&h_type->tag;
          cVar5 = pcVar22[uVar18 + (long)iVar23];
          local_40 = (SAM_hdr_tag *)0x0;
          do {
            iVar8 = (int)pSVar17;
            if (cVar5 != '\t') goto LAB_0012f16b;
            uVar21 = (int)uVar18 + 1;
            uVar24 = (ulong)(int)uVar21;
            uVar18 = (ulong)uVar21;
            uVar12 = uVar24;
            if ((int)uVar21 < l) {
              uVar18 = sVar9 & 0xffffffff;
            }
            for (; (long)uVar12 < (long)l; uVar12 = uVar12 + 1) {
              if ((byte)(pcVar22[uVar12 + (long)iVar23] - 9U) < 2) {
                uVar18 = uVar12 & 0xffffffff;
                break;
              }
            }
            pSVar15 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
            if (pSVar15 == (SAM_hdr_tag *)0x0) {
              return -1;
            }
            iVar20 = (int)uVar18;
            iVar19 = iVar20 - uVar21;
            pSVar17 = sh;
            pcVar13 = string_ndup(sh->str_pool,pcVar22 + uVar24 + (long)iVar23,(long)iVar19);
            iVar8 = (int)pSVar17;
            pSVar15->str = pcVar13;
            pSVar15->len = iVar19;
            pSVar15->next = (SAM_hdr_tag_s *)0x0;
            if (pcVar13 == (char *)0x0) {
              return -1;
            }
            if ((iVar19 < 3) || (pcVar13[2] != ':')) {
              pcVar22 = "Malformed key:value pair";
              goto LAB_0012f196;
            }
            pSVar14 = local_40;
            if (local_40 == (SAM_hdr_tag *)0x0) {
              pSVar14 = local_38;
            }
            pSVar14->next = pSVar15;
          } while ((iVar20 < l) &&
                  (cVar5 = pcVar22[(long)iVar20 + (long)iVar23], local_40 = pSVar15, cVar5 != '\n'))
          ;
        }
        iVar8 = sam_hdr_update_hashes(sh,key,h_type);
        if (iVar8 == -1) {
          return -1;
        }
      }
      iVar6 = (int)uVar18 + 1;
      iVar8 = iVar6;
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int sam_hdr_add_lines(SAM_hdr *sh, const char *lines, int len) {
    int i, lno = 1, text_offset;
    char *hdr;

    if (!len)
	len = strlen(lines);

    text_offset = ks_len(&sh->text);
    if (EOF == kputsn(lines, len, &sh->text))
	return -1;
    hdr = ks_str(&sh->text) + text_offset;

    for (i = 0; i < len; i++) {
	khint32_t type;
	khint_t k;

	int l_start = i, new;
	SAM_hdr_type *h_type;
	SAM_hdr_tag *h_tag, *last;

	if (hdr[i] != '@') {
	    int j;
	    for (j = i; j < len && hdr[j] != '\n'; j++)
		;
	    sam_hdr_error("Header line does not start with '@'",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	type = (hdr[i+1]<<8) | hdr[i+2];
	if (hdr[i+1] < 'A' || hdr[i+1] > 'z' ||
	    hdr[i+2] < 'A' || hdr[i+2] > 'z') {
	    sam_hdr_error("Header line does not have a two character key",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	i += 3;
	if (hdr[i] == '\n')
	    continue;

	// Add the header line type
	if (!(h_type = pool_alloc(sh->type_pool)))
	    return -1;
	if (-1 == (k = kh_put(sam_hdr, sh->h, type, &new)))
	    return -1;

	// Form the ring, either with self or other lines of this type
	if (!new) {
	    SAM_hdr_type *t = kh_val(sh->h, k), *p;
	    p = t->prev;
	    
	    assert(p->next = t);
	    p->next = h_type;
	    h_type->prev = p;

	    t->prev = h_type;
	    h_type->next = t;
	    h_type->order = p->order+1;
	} else {
	    kh_val(sh->h, k) = h_type;
	    h_type->prev = h_type->next = h_type;
	    h_type->order = 0;
	}

	// Parse the tags on this line
	last = NULL;
	if ((type>>8) == 'C' && (type&0xff) == 'O') {
	    int j;
	    if (hdr[i] != '\t') {
		sam_hdr_error("Missing tab",
			      &hdr[l_start], len - l_start, lno);
		return -1;
	    }

	    for (j = ++i; j < len && hdr[j] != '\n'; j++)
		;

	    if (!(h_type->tag = h_tag = pool_alloc(sh->tag_pool)))
		return -1;
	    h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
	    h_tag->len = j-i;
	    h_tag->next = NULL;
	    if (!h_tag->str)
		return -1;

	    i = j;

	} else {
	    do {
		int j;
		if (hdr[i] != '\t') {
		    sam_hdr_error("Missing tab",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}

		for (j = ++i; j < len && hdr[j] != '\n' && hdr[j] != '\t'; j++)
		    ;
	    
		if (!(h_tag = pool_alloc(sh->tag_pool)))
		    return -1;
		h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
		h_tag->len = j-i;
		h_tag->next = NULL;
		if (!h_tag->str)
		    return -1;

		if (h_tag->len < 3 || h_tag->str[2] != ':') {
		    sam_hdr_error("Malformed key:value pair",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}
	    
		if (last)
		    last->next = h_tag;
		else
		    h_type->tag = h_tag;

		last = h_tag;
		i = j;
	    } while (i < len && hdr[i] != '\n');
	}

	/* Update RG/SQ hashes */
	if (-1 == sam_hdr_update_hashes(sh, type, h_type))
	    return -1;
    }

    return 0;
}